

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.h
# Opt level: O2

ZyanStatus
ZydisStringAppendShortCase
          (ZyanString *destination,ZydisShortString *source,ZydisLetterCase letter_case)

{
  byte bVar1;
  byte bVar2;
  void *pvVar3;
  ZyanStatus ZVar4;
  ZyanUSize i;
  ulong uVar5;
  ZyanUSize ZVar6;
  
  if ((destination == (ZyanString *)0x0) || (source == (ZydisShortString *)0x0)) {
    __assert_fail("destination && source",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                  ,0x109,
                  "ZyanStatus ZydisStringAppendShortCase(ZyanString *, const ZydisShortString *, ZydisLetterCase)"
                 );
  }
  if ((destination->vector).allocator != (ZyanAllocator *)0x0) {
    __assert_fail("!destination->vector.allocator",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                  ,0x10a,
                  "ZyanStatus ZydisStringAppendShortCase(ZyanString *, const ZydisShortString *, ZydisLetterCase)"
                 );
  }
  ZVar6 = (destination->vector).size;
  if ((ZVar6 != 0) && (uVar5 = (ulong)source->size, uVar5 != 0)) {
    ZVar4 = 0x80100009;
    if (ZVar6 + uVar5 <= (destination->vector).capacity) {
      memcpy((void *)((long)(destination->vector).data + (ZVar6 - 1)),source->data,uVar5 + 1);
      if (letter_case != ZYDIS_LETTER_CASE_DEFAULT) {
        if (letter_case == ZYDIS_LETTER_CASE_MAX_VALUE) {
          ZVar6 = (destination->vector).size;
          pvVar3 = (destination->vector).data;
          bVar1 = source->size;
          for (uVar5 = ZVar6 - 1; uVar5 < (bVar1 + ZVar6) - 1; uVar5 = uVar5 + 1) {
            bVar2 = *(byte *)((long)pvVar3 + uVar5);
            if ((byte)(bVar2 + 0x9f) < 0x1a) {
              *(byte *)((long)pvVar3 + uVar5) = bVar2 & 0x5f;
            }
          }
        }
        else {
          if (letter_case != ZYDIS_LETTER_CASE_LOWER) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                          ,0x13a,
                          "ZyanStatus ZydisStringAppendShortCase(ZyanString *, const ZydisShortString *, ZydisLetterCase)"
                         );
          }
          ZVar6 = (destination->vector).size;
          pvVar3 = (destination->vector).data;
          bVar1 = source->size;
          for (uVar5 = ZVar6 - 1; uVar5 < (bVar1 + ZVar6) - 1; uVar5 = uVar5 + 1) {
            bVar2 = *(byte *)((long)pvVar3 + uVar5);
            if ((byte)(bVar2 + 0xbf) < 0x1a) {
              *(byte *)((long)pvVar3 + uVar5) = bVar2 | 0x20;
            }
          }
        }
      }
      ZVar6 = (ulong)source->size + (destination->vector).size;
      (destination->vector).size = ZVar6;
      ZVar4 = 0x100000;
      if (*(char *)((long)(destination->vector).data + (ZVar6 - 1)) != '\0') {
        __assert_fail("*(char*)((ZyanU8*)(destination)->vector.data + (destination)->vector.size - 1) == \'\\0\'"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                      ,0x13e,
                      "ZyanStatus ZydisStringAppendShortCase(ZyanString *, const ZydisShortString *, ZydisLetterCase)"
                     );
      }
    }
    return ZVar4;
  }
  __assert_fail("destination->vector.size && source->size",
                "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                ,0x10b,
                "ZyanStatus ZydisStringAppendShortCase(ZyanString *, const ZydisShortString *, ZydisLetterCase)"
               );
}

Assistant:

ZYAN_INLINE ZyanStatus ZydisStringAppendShortCase(ZyanString* destination,
    const ZydisShortString* source, ZydisLetterCase letter_case)
{
    ZYAN_ASSERT(destination && source);
    ZYAN_ASSERT(!destination->vector.allocator);
    ZYAN_ASSERT(destination->vector.size && source->size);

    if (destination->vector.size + source->size > destination->vector.capacity)
    {
        return ZYAN_STATUS_INSUFFICIENT_BUFFER_SIZE;
    }

    ZYAN_MEMCPY((char*)destination->vector.data + destination->vector.size - 1, source->data,
        (ZyanUSize)source->size + 1);

    switch (letter_case)
    {
    case ZYDIS_LETTER_CASE_DEFAULT:
        break;
    case ZYDIS_LETTER_CASE_LOWER:
    {
        const ZyanUSize index = destination->vector.size - 1;
        const ZyanUSize count = source->size;
        char* s = (char*)destination->vector.data + index;
        for (ZyanUSize i = index; i < index + count; ++i)
        {
            const char c = *s;
            if ((c >= 'A') && (c <= 'Z'))
            {
                *s = c | 32;
            }
            ++s;
        }
        break;
    }
    case ZYDIS_LETTER_CASE_UPPER:
    {
        const ZyanUSize index = destination->vector.size - 1;
        const ZyanUSize count = source->size;
        char* s = (char*)destination->vector.data + index;
        for (ZyanUSize i = index; i < index + count; ++i)
        {
            const char c = *s;
            if ((c >= 'a') && (c <= 'z'))
            {
                *s = c & ~32;
            }
            ++s;
        }
        break;
    }
    default:
        ZYAN_UNREACHABLE;
    }

    destination->vector.size += source->size;
    ZYDIS_STRING_ASSERT_NULLTERMINATION(destination);

    return ZYAN_STATUS_SUCCESS;
}